

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::update_peer_interest(torrent *this,bool was_finished)

{
  peer_connection *this_00;
  _func_int **pp_Var1;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pppVar5;
  
  pppVar5 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pppVar5 !=
      (this->super_torrent_hot_members).m_connections.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *pppVar5;
      pppVar5 = pppVar5 + 1;
      peer_connection::update_interest(this_00);
    } while (pppVar5 !=
             (this->super_torrent_hot_members).m_connections.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             .
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pp_Var1 = (this->super_request_callback)._vptr_request_callback;
  uVar4 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7;
  if (uVar4 - 2 < 4) {
    iVar3 = (*pp_Var1[6])(this);
    if ((char)iVar3 != '\0') {
      bVar2 = is_finished(this);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** UPDATE_PEER_INTEREST [ finished: %d was_finished %d ]",(ulong)bVar2,
                 (ulong)was_finished);
    }
    bVar2 = is_finished(this);
    if (was_finished) {
      if (!bVar2) {
        resume_download(this);
        return;
      }
    }
    else if (bVar2) {
      finished(this);
      return;
    }
    return;
  }
  UNRECOVERED_JUMPTABLE = pp_Var1[7];
  (*UNRECOVERED_JUMPTABLE)
            (this,"*** UPDATE_PEER_INTEREST [ skipping, state: %d ]",(ulong)uVar4,
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void torrent::update_peer_interest(bool const was_finished)
	{
		for (auto i = begin(); i != end();)
		{
			peer_connection* p = *i;
			// update_interest may disconnect the peer and
			// invalidate the iterator
			++i;
			p->update_interest();
		}

		if (!is_downloading_state(m_state))
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** UPDATE_PEER_INTEREST [ skipping, state: %d ]"
				, int(m_state));
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** UPDATE_PEER_INTEREST [ finished: %d was_finished %d ]"
				, is_finished(), was_finished);
		}
#endif

		// the torrent just became finished
		if (!was_finished && is_finished())
		{
			finished();
		}
		else if (was_finished && !is_finished())
		{
			// if we used to be finished, but we aren't anymore
			// we may need to connect to peers again
			resume_download();
		}
	}